

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Complex.cpp
# Opt level: O1

void __thiscall Complex::add(Complex *this,Complex *options)

{
  double dVar1;
  
  std::vector<EuropeanCall,std::allocator<EuropeanCall>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<EuropeanCall_const*,std::vector<EuropeanCall,std::allocator<EuropeanCall>>>>
            ((vector<EuropeanCall,std::allocator<EuropeanCall>> *)&this->european_call,
             (this->european_call).super__Vector_base<EuropeanCall,_std::allocator<EuropeanCall>_>.
             _M_impl.super__Vector_impl_data._M_finish,
             (options->european_call).
             super__Vector_base<EuropeanCall,_std::allocator<EuropeanCall>_>._M_impl.
             super__Vector_impl_data._M_start,
             (options->european_call).
             super__Vector_base<EuropeanCall,_std::allocator<EuropeanCall>_>._M_impl.
             super__Vector_impl_data._M_finish);
  std::vector<EuropeanPut,std::allocator<EuropeanPut>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<EuropeanPut_const*,std::vector<EuropeanPut,std::allocator<EuropeanPut>>>>
            ((vector<EuropeanPut,std::allocator<EuropeanPut>> *)&this->european_put,
             (this->european_put).super__Vector_base<EuropeanPut,_std::allocator<EuropeanPut>_>.
             _M_impl.super__Vector_impl_data._M_finish,
             (options->european_put).super__Vector_base<EuropeanPut,_std::allocator<EuropeanPut>_>.
             _M_impl.super__Vector_impl_data._M_start,
             (options->european_put).super__Vector_base<EuropeanPut,_std::allocator<EuropeanPut>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  std::vector<DigitalCall,std::allocator<DigitalCall>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<DigitalCall_const*,std::vector<DigitalCall,std::allocator<DigitalCall>>>>
            ((vector<DigitalCall,std::allocator<DigitalCall>> *)&this->digital_call,
             (this->digital_call).super__Vector_base<DigitalCall,_std::allocator<DigitalCall>_>.
             _M_impl.super__Vector_impl_data._M_finish,
             (options->digital_call).super__Vector_base<DigitalCall,_std::allocator<DigitalCall>_>.
             _M_impl.super__Vector_impl_data._M_start,
             (options->digital_call).super__Vector_base<DigitalCall,_std::allocator<DigitalCall>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  std::vector<DigitalPut,std::allocator<DigitalPut>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<DigitalPut_const*,std::vector<DigitalPut,std::allocator<DigitalPut>>>>
            ((vector<DigitalPut,std::allocator<DigitalPut>> *)&this->digital_put,
             (this->digital_put).super__Vector_base<DigitalPut,_std::allocator<DigitalPut>_>._M_impl
             .super__Vector_impl_data._M_finish,
             (options->digital_put).super__Vector_base<DigitalPut,_std::allocator<DigitalPut>_>.
             _M_impl.super__Vector_impl_data._M_start,
             (options->digital_put).super__Vector_base<DigitalPut,_std::allocator<DigitalPut>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  std::vector<AsianArithmeticCall,std::allocator<AsianArithmeticCall>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<AsianArithmeticCall_const*,std::vector<AsianArithmeticCall,std::allocator<AsianArithmeticCall>>>>
            ((vector<AsianArithmeticCall,std::allocator<AsianArithmeticCall>> *)
             &this->asian_arithmetic_call,
             (this->asian_arithmetic_call).
             super__Vector_base<AsianArithmeticCall,_std::allocator<AsianArithmeticCall>_>._M_impl.
             super__Vector_impl_data._M_finish,
             (options->asian_arithmetic_call).
             super__Vector_base<AsianArithmeticCall,_std::allocator<AsianArithmeticCall>_>._M_impl.
             super__Vector_impl_data._M_start,
             (options->asian_arithmetic_call).
             super__Vector_base<AsianArithmeticCall,_std::allocator<AsianArithmeticCall>_>._M_impl.
             super__Vector_impl_data._M_finish);
  std::vector<AsianArithmeticPut,std::allocator<AsianArithmeticPut>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<AsianArithmeticPut_const*,std::vector<AsianArithmeticPut,std::allocator<AsianArithmeticPut>>>>
            ((vector<AsianArithmeticPut,std::allocator<AsianArithmeticPut>> *)
             &this->asian_arithmetic_put,
             (this->asian_arithmetic_put).
             super__Vector_base<AsianArithmeticPut,_std::allocator<AsianArithmeticPut>_>._M_impl.
             super__Vector_impl_data._M_finish,
             (options->asian_arithmetic_put).
             super__Vector_base<AsianArithmeticPut,_std::allocator<AsianArithmeticPut>_>._M_impl.
             super__Vector_impl_data._M_start,
             (options->asian_arithmetic_put).
             super__Vector_base<AsianArithmeticPut,_std::allocator<AsianArithmeticPut>_>._M_impl.
             super__Vector_impl_data._M_finish);
  std::vector<AsianGeometricCall,std::allocator<AsianGeometricCall>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<AsianGeometricCall_const*,std::vector<AsianGeometricCall,std::allocator<AsianGeometricCall>>>>
            ((vector<AsianGeometricCall,std::allocator<AsianGeometricCall>> *)
             &this->asian_geometric_call,
             (this->asian_geometric_call).
             super__Vector_base<AsianGeometricCall,_std::allocator<AsianGeometricCall>_>._M_impl.
             super__Vector_impl_data._M_finish,
             (options->asian_geometric_call).
             super__Vector_base<AsianGeometricCall,_std::allocator<AsianGeometricCall>_>._M_impl.
             super__Vector_impl_data._M_start,
             (options->asian_geometric_call).
             super__Vector_base<AsianGeometricCall,_std::allocator<AsianGeometricCall>_>._M_impl.
             super__Vector_impl_data._M_finish);
  std::vector<AsianGeometricPut,std::allocator<AsianGeometricPut>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<AsianGeometricPut_const*,std::vector<AsianGeometricPut,std::allocator<AsianGeometricPut>>>>
            ((vector<AsianGeometricPut,std::allocator<AsianGeometricPut>> *)
             &this->asian_geometric_put,
             (this->asian_geometric_put).
             super__Vector_base<AsianGeometricPut,_std::allocator<AsianGeometricPut>_>._M_impl.
             super__Vector_impl_data._M_finish,
             (options->asian_geometric_put).
             super__Vector_base<AsianGeometricPut,_std::allocator<AsianGeometricPut>_>._M_impl.
             super__Vector_impl_data._M_start,
             (options->asian_geometric_put).
             super__Vector_base<AsianGeometricPut,_std::allocator<AsianGeometricPut>_>._M_impl.
             super__Vector_impl_data._M_finish);
  dVar1 = options->max_T;
  if (options->max_T <= this->max_T) {
    dVar1 = this->max_T;
  }
  this->max_T = dVar1;
  return;
}

Assistant:

void Complex::add(Complex const& options)
{
	european_call.insert(european_call.end(), options.european_call.begin(), options.european_call.end());
	european_put.insert(european_put.end(), options.european_put.begin(), options.european_put.end());
	digital_call.insert(digital_call.end(), options.digital_call.begin(), options.digital_call.end());
	digital_put.insert(digital_put.end(), options.digital_put.begin(), options.digital_put.end());
	asian_arithmetic_call.insert(asian_arithmetic_call.end(), options.asian_arithmetic_call.begin(), options.asian_arithmetic_call.end());
	asian_arithmetic_put.insert(asian_arithmetic_put.end(), options.asian_arithmetic_put.begin(), options.asian_arithmetic_put.end());
	asian_geometric_call.insert(asian_geometric_call.end(), options.asian_geometric_call.begin(), options.asian_geometric_call.end());
	asian_geometric_put.insert(asian_geometric_put.end(), options.asian_geometric_put.begin(), options.asian_geometric_put.end());

	max_T = std::max(max_T, options.max_T);
}